

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O0

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  undefined1 local_30 [4];
  int r;
  uv_mutex_t mutex;
  
  iVar1 = uv_mutex_init_recursive((uv_mutex_t *)local_30);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x3a,"r == 0");
    abort();
  }
  uv_mutex_lock((uv_mutex_t *)local_30);
  uv_mutex_lock((uv_mutex_t *)local_30);
  iVar1 = uv_mutex_trylock((uv_mutex_t *)local_30);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x3e,"0 == uv_mutex_trylock(&mutex)");
    abort();
  }
  uv_mutex_unlock((uv_mutex_t *)local_30);
  uv_mutex_unlock((uv_mutex_t *)local_30);
  uv_mutex_unlock((uv_mutex_t *)local_30);
  uv_mutex_destroy((uv_mutex_t *)local_30);
  return 0;
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT(0 == uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}